

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

bool __thiscall ON_Mesh::SetQuad(ON_Mesh *this,int face_index,int a,int b,int c,int d)

{
  ON_MeshFace *pOVar1;
  int iVar2;
  bool bVar3;
  ON_MeshFace f;
  ON_MeshFace local_18;
  
  if (face_index < 0) {
    return false;
  }
  iVar2 = (this->m_F).m_count;
  local_18.vi[0] = a;
  local_18.vi[1] = b;
  local_18.vi[2] = c;
  local_18.vi[3] = d;
  if (face_index < iVar2) {
    pOVar1 = (this->m_F).m_a + (uint)face_index;
    *(ulong *)pOVar1->vi = CONCAT44(b,a);
    *(ulong *)(pOVar1->vi + 2) = CONCAT44(d,c);
  }
  else {
    if (iVar2 != face_index) {
      return false;
    }
    ON_SimpleArray<ON_MeshFace>::Append(&this->m_F,&local_18);
  }
  bVar3 = ON_MeshFace::IsValid(&local_18,(this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count);
  return bVar3;
}

Assistant:

bool ON_Mesh::SetQuad(
       int face_index,
       int a, int b, int c, int d // vertex indices
       )
{
  bool rc = false;
  int face_count = m_F.Count();
  if ( face_index >= 0 ) {
    ON_MeshFace f;
    f.vi[0] = a;
    f.vi[1] = b;
    f.vi[2] = c;
    f.vi[3] = d;
    if ( face_index < face_count ) {
      m_F[face_index] = f;
      rc = true;
    }
    else if ( face_index == face_count ) {
      m_F.Append(f);
      rc = true;
    }
    if ( rc )
      rc = f.IsValid(m_V.Count());
  }
  return rc;
}